

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_i2rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  undefined2 uVar1;
  bool bVar2;
  int local_7c;
  int checknull;
  int tstatus;
  int anynul;
  short nullvalue;
  short *intarray;
  long ny;
  long nx;
  long nelem;
  long jj;
  long ii;
  int *status_local;
  fitsfile *outfptr_local;
  double rescale_local;
  long *naxes_local;
  fitsfile *pfStack_18;
  int naxis_local;
  fitsfile *infptr_local;
  
  nx = 1;
  ny = *naxes;
  intarray = (short *)0x1;
  for (jj = 1; jj < naxis; jj = jj + 1) {
    intarray = (short *)((long)intarray * naxes[jj]);
  }
  ii = (long)status;
  status_local = &outfptr->HDUposition;
  outfptr_local = (fitsfile *)rescale;
  rescale_local = (double)naxes;
  naxes_local._4_4_ = naxis;
  pfStack_18 = infptr;
  _anynul = calloc(ny,2);
  if (_anynul == (void *)0x0) {
    *(undefined4 *)ii = 0x71;
    infptr_local._4_4_ = *(int *)ii;
  }
  else {
    local_7c = 0;
    ffgky(pfStack_18,0x15,"BLANK",(long)&tstatus + 2,0,&local_7c);
    bVar2 = local_7c == 0;
    ffpscl(0x3ff0000000000000,pfStack_18,ii);
    ffpscl(0x3ff0000000000000,status_local,ii);
    for (jj = 0; jj < (long)intarray; jj = jj + 1) {
      ffgpvi(pfStack_18,1,nx,ny,0,_anynul,&checknull,ii);
      if (bVar2) {
        for (nelem = 0; nelem < ny; nelem = nelem + 1) {
          if (*(short *)((long)_anynul + nelem * 2) != tstatus._2_2_) {
            if ((double)(int)*(short *)((long)_anynul + nelem * 2) / (double)outfptr_local < 0.0) {
              uVar1 = (undefined2)
                      (int)((double)(int)*(short *)((long)_anynul + nelem * 2) /
                            (double)outfptr_local + -0.5);
            }
            else {
              uVar1 = (undefined2)
                      (int)((double)(int)*(short *)((long)_anynul + nelem * 2) /
                            (double)outfptr_local + 0.5);
            }
            *(undefined2 *)((long)_anynul + nelem * 2) = uVar1;
          }
        }
      }
      else {
        for (nelem = 0; nelem < ny; nelem = nelem + 1) {
          if ((double)(int)*(short *)((long)_anynul + nelem * 2) / (double)outfptr_local < 0.0) {
            uVar1 = (undefined2)
                    (int)((double)(int)*(short *)((long)_anynul + nelem * 2) / (double)outfptr_local
                         + -0.5);
          }
          else {
            uVar1 = (undefined2)
                    (int)((double)(int)*(short *)((long)_anynul + nelem * 2) / (double)outfptr_local
                         + 0.5);
          }
          *(undefined2 *)((long)_anynul + nelem * 2) = uVar1;
        }
      }
      ffppri(status_local,1,nx,ny,_anynul,ii);
      nx = ny + nx;
    }
    free(_anynul);
    infptr_local._4_4_ = *(int *)ii;
  }
  return infptr_local._4_4_;
}

Assistant:

int fp_i2rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	short *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(short));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TSHORT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_sht(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NSHRT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_sht(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}